

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

string * __thiscall
cmComputeLinkInformation::NoCaseExpression_abi_cxx11_
          (string *__return_storage_ptr__,cmComputeLinkInformation *this,char *str)

{
  int iVar1;
  char *local_30;
  char *s;
  char *str_local;
  cmComputeLinkInformation *this_local;
  string *ret;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (local_30 = str; *local_30 != '\0'; local_30 = local_30 + 1) {
    if (*local_30 == '.') {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*local_30);
    }
    else {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"[");
      iVar1 = tolower((int)*local_30);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(char)iVar1);
      iVar1 = toupper((int)*local_30);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(char)iVar1);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"]");
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmComputeLinkInformation::NoCaseExpression(const char* str)
{
  std::string ret;
  const char* s = str;
  while (*s) {
    if (*s == '.') {
      ret += *s;
    } else {
      ret += "[";
      ret += static_cast<char>(tolower(*s));
      ret += static_cast<char>(toupper(*s));
      ret += "]";
    }
    s++;
  }
  return ret;
}